

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hh
# Opt level: O0

Value __thiscall Typelib::FieldGetter::apply(FieldGetter *this,Value v,string *name)

{
  void *pvVar1;
  FieldNotFound *this_00;
  Value VVar2;
  Value local_48;
  string *local_38;
  string *name_local;
  FieldGetter *this_local;
  Value v_local;
  
  v_local.m_data = (void *)v.m_type.t_;
  this_local = (FieldGetter *)v.m_data;
  local_38 = name;
  name_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)name);
  Value::Value(&local_48);
  (this->m_field).m_data = local_48.m_data;
  (this->m_field).m_type.t_ = local_48.m_type.t_;
  VVar2.m_type.t_ = (Type *)this_local;
  VVar2.m_data = this;
  Typelib::ValueVisitor::apply(VVar2);
  pvVar1 = Value::getData(&this->m_field);
  if (pvVar1 == (void *)0x0) {
    this_00 = (FieldNotFound *)__cxa_allocate_exception(0x28);
    FieldNotFound::FieldNotFound(this_00,local_38);
    __cxa_throw(this_00,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
  }
  return this->m_field;
}

Assistant:

Value apply(Value v, std::string const& name)
        {
            m_name = name;
            m_field = Value();
            ValueVisitor::apply(v);
            if (! m_field.getData())
                throw FieldNotFound(name);
            return m_field;
        }